

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderBMP.cpp
# Opt level: O0

IImage * __thiscall irr::video::CImageLoaderBMP::loadImage(CImageLoaderBMP *this,IReadFile *file)

{
  bool bVar1;
  int iVar2;
  CImageLoaderBMP *this_00;
  s16 *out;
  IImage *this_01;
  IImage *this_02;
  uint uVar3;
  uint uVar4;
  long *in_RSI;
  undefined8 in_RDI;
  float fVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  IImage *image;
  dimension2d<unsigned_int> dim;
  u8 *bmpData;
  s32 lineSize;
  f32 t;
  s32 widthInBytes;
  s32 *paletteData;
  s32 paletteSize;
  s32 paletteAllocSize;
  long pos;
  s32 pitch;
  SBMPHeader header;
  undefined4 in_stack_fffffffffffffeb8;
  s32 in_stack_fffffffffffffebc;
  s32 in_stack_fffffffffffffec0;
  undefined1 uVar7;
  s32 in_stack_fffffffffffffec4;
  s32 *in_stack_fffffffffffffec8;
  CImage *in_stack_fffffffffffffed0;
  s16 *in_stack_fffffffffffffed8;
  u8 *in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  u8 **in_stack_ffffffffffffff18;
  CImageLoaderBMP *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  CImageLoaderBMP *pCVar8;
  int local_7c;
  void *local_78;
  short local_4e [5];
  int local_44;
  u32 local_3c;
  u32 local_38;
  ushort local_32;
  uint local_30;
  uint local_2c;
  long *local_18;
  IImage *local_8;
  
  local_18 = in_RSI;
  dVar6 = (double)(**(code **)*in_RSI)(in_RSI,local_4e,0x36);
  if (local_4e[0] == 0x4d42) {
    if (local_30 < 3) {
      if ((local_32 < 0x21) &&
         (bVar1 = checkImageDimensions(local_3c,local_38), dVar6 = extraout_XMM0_Qa, bVar1)) {
        local_2c = (4 - (local_2c & 3) & 3) + local_2c;
        (**(code **)(*local_18 + 0x18))();
        iVar2 = core::clamp<int>((int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0
                                                ),
                                 (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8
                                                ),(int *)0x3786f9);
        uVar7 = (undefined1)((uint)in_stack_fffffffffffffeb8 >> 0x18);
        local_78 = (void *)0x0;
        if (iVar2 != 0) {
          local_78 = operator_new__(0x400);
          memset(local_78,0,0x400);
          (**(code **)*local_18)(local_18,local_78,(long)iVar2 << 2);
        }
        if (local_2c == 0) {
          iVar2 = (**(code **)(*local_18 + 0x10))();
          local_2c = iVar2 - local_44;
        }
        (**(code **)(*local_18 + 8))(local_18,local_44,0);
        fVar5 = (float)local_3c * ((float)local_32 / 8.0);
        local_7c = (int)fVar5;
        fVar5 = fVar5 - (float)local_7c;
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          local_7c = local_7c + 1;
        }
        uVar3 = 4 - local_7c % 4;
        uVar4 = uVar3;
        if ((int)uVar3 < 0) {
          uVar4 = 7 - local_7c % 4;
        }
        iVar2 = local_7c + (uVar3 - (uVar4 & 0xfffffffc));
        local_7c = iVar2 - local_7c;
        this_00 = (CImageLoaderBMP *)operator_new__((ulong)local_2c);
        dVar6 = (double)(**(code **)*local_18)(local_18,this_00,local_2c);
        if (local_30 == 1) {
          decompress8BitRLE(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                            (s32)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                            (s32)in_stack_ffffffffffffff10,
                            (s32)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                            (s32)in_stack_ffffffffffffff08);
          local_2c = (local_3c + local_7c) * local_38;
          dVar6 = extraout_XMM0_Qa_00;
        }
        else if (local_30 == 2) {
          decompress4BitRLE(this_00,(u8 **)CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68),
                            (s32)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                            (s32)in_stack_ffffffffffffff60,(s32)((ulong)in_RDI >> 0x20),(s32)in_RDI)
          ;
          local_2c = ((local_3c + 1 >> 1) + local_7c) * local_38;
          dVar6 = extraout_XMM0_Qa_01;
        }
        if (local_2c < iVar2 * local_38) {
          os::Printer::log((Printer *)"Bitmap data is cut off.",dVar6);
          if (local_78 != (void *)0x0) {
            operator_delete__(local_78);
          }
          if (this_00 != (CImageLoaderBMP *)0x0) {
            operator_delete__(this_00);
          }
          local_8 = (IImage *)0x0;
        }
        else {
          core::dimension2d<unsigned_int>::dimension2d
                    ((dimension2d<unsigned_int> *)&stack0xffffffffffffff68);
          this_02 = (IImage *)0x0;
          pCVar8 = this_00;
          switch(local_32) {
          case 1:
            this_02 = (IImage *)operator_new(0x50);
            CImage::CImage(in_stack_fffffffffffffed0,
                           (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                           (dimension2d<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            pCVar8 = this_00;
            if (this_02 != (IImage *)0x0) {
              out = (s16 *)IImage::getData(this_02);
              CColorConverter::convert1BitTo16Bit((u8 *)this_00,out,local_3c,local_38,local_7c,true)
              ;
            }
            break;
          case 4:
            this_02 = (IImage *)operator_new(0x50);
            CImage::CImage(in_stack_fffffffffffffed0,
                           (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                           (dimension2d<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            uVar7 = (undefined1)((uint)in_stack_fffffffffffffec0 >> 0x18);
            pCVar8 = this_00;
            if (this_02 != (IImage *)0x0) {
              IImage::getData(this_02);
              CColorConverter::convert4BitTo16Bit
                        (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (s32)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                         (s32)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec4,(bool)uVar7);
              pCVar8 = this_00;
            }
            break;
          case 8:
            this_02 = (IImage *)operator_new(0x50);
            CImage::CImage(in_stack_fffffffffffffed0,
                           (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                           (dimension2d<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            uVar7 = (undefined1)((uint)in_stack_fffffffffffffec0 >> 0x18);
            pCVar8 = this_00;
            if (this_02 != (IImage *)0x0) {
              IImage::getData(this_02);
              CColorConverter::convert8BitTo16Bit
                        (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (s32)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                         (s32)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec4,(bool)uVar7);
              pCVar8 = this_00;
            }
            break;
          case 0x10:
            this_02 = (IImage *)operator_new(0x50);
            CImage::CImage(in_stack_fffffffffffffed0,
                           (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                           (dimension2d<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            pCVar8 = this_00;
            if (this_02 != (IImage *)0x0) {
              IImage::getData(this_02);
              CColorConverter::convert16BitTo16Bit
                        ((s16 *)in_stack_fffffffffffffed0,(s16 *)in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffebc,(bool)uVar7);
              pCVar8 = this_00;
            }
            break;
          case 0x18:
            this_01 = (IImage *)operator_new(0x50);
            CImage::CImage(in_stack_fffffffffffffed0,
                           (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                           (dimension2d<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            this_02 = this_01;
            pCVar8 = this_00;
            if (this_01 != (IImage *)0x0) {
              IImage::getData(this_01);
              CColorConverter::convert24BitTo24Bit
                        ((u8 *)this_01,(u8 *)this_00,(s32)((ulong)in_stack_fffffffffffffee0 >> 0x20)
                         ,(s32)in_stack_fffffffffffffee0,
                         (s32)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffffed8 >> 0x18,0),
                         SUB81((ulong)in_stack_fffffffffffffed8 >> 0x10,0));
            }
            break;
          case 0x20:
            this_02 = (IImage *)operator_new(0x50);
            CImage::CImage(in_stack_fffffffffffffed0,
                           (ECOLOR_FORMAT)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                           (dimension2d<unsigned_int> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            pCVar8 = this_00;
            if (this_02 != (IImage *)0x0) {
              IImage::getData(this_02);
              CColorConverter::convert32BitTo32Bit
                        ((s32 *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffebc,(bool)uVar7);
              pCVar8 = this_00;
            }
          }
          if (local_78 != (void *)0x0) {
            operator_delete__(local_78);
          }
          local_8 = this_02;
          if (pCVar8 != (CImageLoaderBMP *)0x0) {
            operator_delete__(pCVar8);
            local_8 = this_02;
          }
        }
      }
      else {
        os::Printer::log((Printer *)"Rejecting BMP with unreasonable size or BPP.",dVar6);
        local_8 = (IImage *)0x0;
      }
    }
    else {
      os::Printer::log((Printer *)"Compression mode not supported.",dVar6);
      local_8 = (IImage *)0x0;
    }
  }
  else {
    local_8 = (IImage *)0x0;
  }
  return local_8;
}

Assistant:

IImage *CImageLoaderBMP::loadImage(io::IReadFile *file) const
{
	SBMPHeader header;

	file->read(&header, sizeof(header));

#ifdef __BIG_ENDIAN__
	header.Id = os::Byteswap::byteswap(header.Id);
	header.FileSize = os::Byteswap::byteswap(header.FileSize);
	header.BitmapDataOffset = os::Byteswap::byteswap(header.BitmapDataOffset);
	header.BitmapHeaderSize = os::Byteswap::byteswap(header.BitmapHeaderSize);
	header.Width = os::Byteswap::byteswap(header.Width);
	header.Height = os::Byteswap::byteswap(header.Height);
	header.Planes = os::Byteswap::byteswap(header.Planes);
	header.BPP = os::Byteswap::byteswap(header.BPP);
	header.Compression = os::Byteswap::byteswap(header.Compression);
	header.BitmapDataSize = os::Byteswap::byteswap(header.BitmapDataSize);
	header.PixelPerMeterX = os::Byteswap::byteswap(header.PixelPerMeterX);
	header.PixelPerMeterY = os::Byteswap::byteswap(header.PixelPerMeterY);
	header.Colors = os::Byteswap::byteswap(header.Colors);
	header.ImportantColors = os::Byteswap::byteswap(header.ImportantColors);
#endif

	s32 pitch = 0;

	//! return if the header is false

	if (header.Id != 0x4d42)
		return 0;

	if (header.Compression > 2) { // we'll only handle RLE-Compression
		os::Printer::log("Compression mode not supported.", ELL_ERROR);
		return 0;
	}

	if (header.BPP > 32 || !checkImageDimensions(header.Width, header.Height)) {
		os::Printer::log("Rejecting BMP with unreasonable size or BPP.", ELL_ERROR);
		return 0;
	}

	// adjust bitmap data size to dword boundary
	header.BitmapDataSize += (4 - (header.BitmapDataSize % 4)) % 4;

	// read palette

	long pos = file->getPos();
	constexpr s32 paletteAllocSize = 256;
	s32 paletteSize = (header.BitmapDataOffset - pos) / 4;
	paletteSize = core::clamp(paletteSize, 0, paletteAllocSize);

	s32 *paletteData = 0;
	if (paletteSize) {
		// always allocate an 8-bit palette to ensure enough space
		paletteData = new s32[paletteAllocSize];
		memset(paletteData, 0, paletteAllocSize * sizeof(s32));
		file->read(paletteData, paletteSize * sizeof(s32));
#ifdef __BIG_ENDIAN__
		for (s32 i = 0; i < paletteSize; ++i)
			paletteData[i] = os::Byteswap::byteswap(paletteData[i]);
#endif
	}

	// read image data

	if (!header.BitmapDataSize) {
		// okay, lets guess the size
		// some tools simply don't set it
		header.BitmapDataSize = static_cast<u32>(file->getSize()) - header.BitmapDataOffset;
	}

	file->seek(header.BitmapDataOffset);

	s32 widthInBytes;
	{
		f32 t = (header.Width) * (header.BPP / 8.0f);
		widthInBytes = (s32)t;
		t -= widthInBytes;
		if (t != 0.0f)
			++widthInBytes;
	}

	const s32 lineSize = widthInBytes + ((4 - (widthInBytes % 4))) % 4;
	pitch = lineSize - widthInBytes;

	u8 *bmpData = new u8[header.BitmapDataSize];
	file->read(bmpData, header.BitmapDataSize);

	// decompress data if needed
	switch (header.Compression) {
	case 1: // 8 bit rle
		decompress8BitRLE(bmpData, header.BitmapDataSize, header.Width, header.Height, pitch);
		header.BitmapDataSize = (header.Width + pitch) * header.Height;
		break;
	case 2: // 4 bit rle
		decompress4BitRLE(bmpData, header.BitmapDataSize, header.Width, header.Height, pitch);
		header.BitmapDataSize = ((header.Width + 1) / 2 + pitch) * header.Height;
		break;
	}

	if (header.BitmapDataSize < lineSize * header.Height) {
		os::Printer::log("Bitmap data is cut off.", ELL_ERROR);

		delete[] paletteData;
		delete[] bmpData;
		return 0;
	}

	// create surface
	core::dimension2d<u32> dim;
	dim.Width = header.Width;
	dim.Height = header.Height;

	IImage *image = 0;
	switch (header.BPP) {
	case 1:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert1BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	case 4:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert4BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, paletteData, pitch, true);
		break;
	case 8:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert8BitTo16Bit(bmpData, (s16 *)image->getData(), header.Width, header.Height, paletteData, pitch, true);
		break;
	case 16:
		image = new CImage(ECF_A1R5G5B5, dim);
		if (image)
			CColorConverter::convert16BitTo16Bit((s16 *)bmpData, (s16 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	case 24:
		image = new CImage(ECF_R8G8B8, dim);
		if (image)
			CColorConverter::convert24BitTo24Bit(bmpData, (u8 *)image->getData(), header.Width, header.Height, pitch, true, true);
		break;
	case 32: // thx to Reinhard Ostermeier
		image = new CImage(ECF_A8R8G8B8, dim);
		if (image)
			CColorConverter::convert32BitTo32Bit((s32 *)bmpData, (s32 *)image->getData(), header.Width, header.Height, pitch, true);
		break;
	};

	// clean up

	delete[] paletteData;
	delete[] bmpData;

	return image;
}